

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

bool __thiscall CaDiCaL::Solver::disconnect_proof_tracer(Solver *this,Tracer *tracer)

{
  bool bVar1;
  char *__ptr;
  size_t sStack_20;
  
  require_solver_pointer_to_be_non_zero
            (this,"bool CaDiCaL::Solver::disconnect_proof_tracer(Tracer *)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
            );
  if (this->external == (External *)0x0) {
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
            "bool CaDiCaL::Solver::disconnect_proof_tracer(Tracer *)",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    __ptr = "external solver not initialized";
  }
  else {
    if (this->internal != (Internal *)0x0) {
      if ((this->_state & VALID) == 0) {
        fatal_message_start();
        fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
                "bool CaDiCaL::Solver::disconnect_proof_tracer(Tracer *)",
                "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
               );
        __ptr = "solver in invalid state";
        sStack_20 = 0x17;
      }
      else {
        if (tracer != (Tracer *)0x0) {
          bVar1 = Internal::disconnect_proof_tracer(this->internal,tracer);
          return bVar1;
        }
        fatal_message_start();
        fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
                "bool CaDiCaL::Solver::disconnect_proof_tracer(Tracer *)",
                "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
               );
        __ptr = "can not disconnect zero tracer";
        sStack_20 = 0x1e;
      }
      goto LAB_006895b2;
    }
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
            "bool CaDiCaL::Solver::disconnect_proof_tracer(Tracer *)",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    __ptr = "internal solver not initialized";
  }
  sStack_20 = 0x1f;
LAB_006895b2:
  fwrite(__ptr,sStack_20,1,_stderr);
  fputc(10,_stderr);
  fflush(_stderr);
  abort();
}

Assistant:

bool Solver::disconnect_proof_tracer (Tracer *tracer) {
  LOG_API_CALL_BEGIN ("disconnect proof tracer");
  REQUIRE_VALID_STATE ();
  REQUIRE (tracer, "can not disconnect zero tracer");
  bool res = internal->disconnect_proof_tracer (tracer);
  LOG_API_CALL_RETURNS ("connect proof tracer", res);
  return res;
}